

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.cc
# Opt level: O0

SegmentIdentificationHeader * lrit::getHeader<lrit::SegmentIdentificationHeader>(Buffer *b,int pos)

{
  int iVar1;
  size_t in_RCX;
  int in_EDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  Buffer *in_RSI;
  SegmentIdentificationHeader *in_RDI;
  HeaderReader<lrit::SegmentIdentificationHeader> r;
  HeaderReader<lrit::SegmentIdentificationHeader> *in_stack_ffffffffffffffd0;
  
  HeaderReader<lrit::SegmentIdentificationHeader>::HeaderReader
            ((HeaderReader<lrit::SegmentIdentificationHeader> *)&stack0xffffffffffffffd0,in_RSI,
             in_EDX);
  HeaderReader<lrit::SegmentIdentificationHeader>::getHeader(in_stack_ffffffffffffffd0);
  iVar1 = (int)in_RDI;
  HeaderReader<lrit::SegmentIdentificationHeader>::read
            ((HeaderReader<lrit::SegmentIdentificationHeader> *)&stack0xffffffffffffffd0,iVar1 + 4,
             __buf,in_RCX);
  HeaderReader<lrit::SegmentIdentificationHeader>::read
            ((HeaderReader<lrit::SegmentIdentificationHeader> *)&stack0xffffffffffffffd0,iVar1 + 6,
             __buf_00,in_RCX);
  HeaderReader<lrit::SegmentIdentificationHeader>::read
            ((HeaderReader<lrit::SegmentIdentificationHeader> *)&stack0xffffffffffffffd0,iVar1 + 8,
             __buf_01,in_RCX);
  HeaderReader<lrit::SegmentIdentificationHeader>::read
            ((HeaderReader<lrit::SegmentIdentificationHeader> *)&stack0xffffffffffffffd0,iVar1 + 10,
             __buf_02,in_RCX);
  HeaderReader<lrit::SegmentIdentificationHeader>::read
            ((HeaderReader<lrit::SegmentIdentificationHeader> *)&stack0xffffffffffffffd0,iVar1 + 0xc
             ,__buf_03,in_RCX);
  HeaderReader<lrit::SegmentIdentificationHeader>::read
            ((HeaderReader<lrit::SegmentIdentificationHeader> *)&stack0xffffffffffffffd0,iVar1 + 0xe
             ,__buf_04,in_RCX);
  HeaderReader<lrit::SegmentIdentificationHeader>::read
            ((HeaderReader<lrit::SegmentIdentificationHeader> *)&stack0xffffffffffffffd0,
             iVar1 + 0x10,__buf_05,in_RCX);
  return in_RDI;
}

Assistant:

SegmentIdentificationHeader getHeader(const Buffer& b, int pos) {
  auto r = HeaderReader<SegmentIdentificationHeader>(b, pos);
  auto h = r.getHeader();
  r.read(&h.imageIdentifier);
  r.read(&h.segmentNumber);
  r.read(&h.segmentStartColumn);
  r.read(&h.segmentStartLine);
  r.read(&h.maxSegment);
  r.read(&h.maxColumn);
  r.read(&h.maxLine);
  return h;
}